

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void * sqlite3_get_auxdata(sqlite3_context *pCtx,int iArg)

{
  VdbeFunc *pVVar1;
  VdbeFunc *pVdbeFunc;
  int iArg_local;
  sqlite3_context *pCtx_local;
  
  pVVar1 = pCtx->pVdbeFunc;
  if (((pVVar1 == (VdbeFunc *)0x0) || (pVVar1->nAux <= iArg)) || (iArg < 0)) {
    pCtx_local = (sqlite3_context *)0x0;
  }
  else {
    pCtx_local = (sqlite3_context *)pVVar1->apAux[iArg].pAux;
  }
  return pCtx_local;
}

Assistant:

SQLITE_API void *sqlite3_get_auxdata(sqlite3_context *pCtx, int iArg){
  VdbeFunc *pVdbeFunc;

  assert( sqlite3_mutex_held(pCtx->s.db->mutex) );
  pVdbeFunc = pCtx->pVdbeFunc;
  if( !pVdbeFunc || iArg>=pVdbeFunc->nAux || iArg<0 ){
    return 0;
  }
  return pVdbeFunc->apAux[iArg].pAux;
}